

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChMatterSPH::AddCollisionModelsToSystem(ChMatterSPH *this)

{
  uint uVar1;
  __shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((this->super_ChIndexedNodes).super_ChPhysicsItem.system != (ChSystem *)0x0) {
    (*(this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0xb])();
    for (uVar1 = 0;
        (ulong)uVar1 <
        (ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4); uVar1 = uVar1 + 1) {
      std::__shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_38,
                   &(((this->super_ChIndexedNodes).super_ChPhysicsItem.system)->collision_system).
                    super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                  );
      (*(local_38._M_ptr)->_vptr_ChCollisionSystem[4])
                (local_38._M_ptr,
                 ((this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar1].
                  super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 collision_model);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    }
    return;
  }
  __assert_fail("GetSystem()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                ,0x274,"virtual void chrono::ChMatterSPH::AddCollisionModelsToSystem()");
}

Assistant:

void ChMatterSPH::AddCollisionModelsToSystem() {
    assert(GetSystem());
    SyncCollisionModels();
    for (unsigned int j = 0; j < nodes.size(); j++) {
        GetSystem()->GetCollisionSystem()->Add(nodes[j]->collision_model);
    }
}